

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
::find<std::__cxx11::string>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  size_t size;
  undefined1 auVar1 [16];
  MixingHashState MVar2;
  uint64_t v;
  iterator iVar3;
  
  AssertHashEqConsistent<std::__cxx11::string>(this,key);
  size = key->_M_string_length;
  MVar2 = hash_internal::MixingHashState::combine_contiguous
                    ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                     (uchar *)(key->_M_dataplus)._M_p,size);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = MVar2.state_ + size;
  iVar3 = find_non_soo<std::__cxx11::string>
                    (this,key,SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),8) ^
                              SUB168(auVar1 * ZEXT816(0x9ddfea08eb382d69),0));
  return iVar3;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }